

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O3

void MapOptHandler_PrecacheClasses(FMapInfoParser *parse,level_info_t *info)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  
  if (parse->format_type == 2) {
    FScanner::MustGetStringName(&parse->sc,"=");
  }
  do {
    FScanner::MustGetString(&parse->sc);
    iVar3 = FName::NameManager::FindName(&FName::NameData,(parse->sc).String,false);
    TArray<FName,_FName>::Grow(&info->PrecacheClasses,1);
    uVar1 = (info->PrecacheClasses).Count;
    (info->PrecacheClasses).Array[uVar1].Index = iVar3;
    (info->PrecacheClasses).Count = uVar1 + 1;
    bVar2 = FScanner::CheckString(&parse->sc,",");
  } while (bVar2);
  return;
}

Assistant:

DEFINE_MAP_OPTION(PrecacheClasses, true)
{
	parse.ParseAssign();

	do
	{
		parse.sc.MustGetString();
		//the class list is not initialized here so all we can do is store the class's name.
		info->PrecacheClasses.Push(parse.sc.String);
	} while (parse.sc.CheckString(","));
}